

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

Abc_Cex_t * Saig_ManCexMinPerform(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  void **ppvVar2;
  void *__ptr;
  int iVar3;
  Vec_Vec_t *vReg2Value;
  Aig_Man_t *pAVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  uVar6 = 0;
  vReg2Value = Saig_ManCexMinComputeReason(pAig,pCex,0);
  iVar1 = vReg2Value->nSize;
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + *(int *)((long)vReg2Value->pArray[lVar5] + 4);
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  if (iVar1 < 1) {
    printf("Reason size = %d.  Ave = %d.\n",(ulong)uVar6,0);
    pAVar4 = Saig_ManCexMinDupWithCubes(pAig,vReg2Value);
    Ioa_WriteAiger(pAVar4,"aigcube.aig",0,0);
    Aig_ManStop(pAVar4);
    printf("Intermediate AIG is written into file \"%s\".\n","aigcube.aig");
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *(int *)((long)vReg2Value->pArray[lVar5] + 4);
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
    printf("Reason size = %d.  Ave = %d.\n",(ulong)uVar6,
           (long)iVar3 / (long)(pCex->iFrame + 1) & 0xffffffff);
    pAVar4 = Saig_ManCexMinDupWithCubes(pAig,vReg2Value);
    Ioa_WriteAiger(pAVar4,"aigcube.aig",0,0);
    Aig_ManStop(pAVar4);
    printf("Intermediate AIG is written into file \"%s\".\n","aigcube.aig");
    if (0 < iVar1) {
      ppvVar2 = vReg2Value->pArray;
      lVar5 = 0;
      do {
        __ptr = ppvVar2[lVar5];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar5 = lVar5 + 1;
      } while (lVar7 != lVar5);
    }
  }
  if (vReg2Value->pArray != (void **)0x0) {
    free(vReg2Value->pArray);
    vReg2Value->pArray = (void **)0x0;
  }
  if (vReg2Value != (Vec_Vec_t *)0x0) {
    free(vReg2Value);
  }
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Saig_ManCexMinPerform( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    int fReasonPi = 0;

    Abc_Cex_t * pCexMin = NULL;
    Aig_Man_t * pManNew = NULL;
    Vec_Vec_t * vFrameReas;
    vFrameReas = Saig_ManCexMinComputeReason( pAig, pCex, fReasonPi );
    printf( "Reason size = %d.  Ave = %d.\n", Vec_VecSizeSize(vFrameReas), Vec_VecSizeSize(vFrameReas)/(pCex->iFrame + 1) );

    // try reducing the frames
    if ( !fReasonPi )
    {
        char * pFileName = "aigcube.aig";
        pManNew = Saig_ManCexMinDupWithCubes( pAig, vFrameReas );
        Ioa_WriteAiger( pManNew, pFileName, 0, 0 );
        Aig_ManStop( pManNew );
        printf( "Intermediate AIG is written into file \"%s\".\n", pFileName );
    }

    // find reduced counter-example
    Vec_VecFree( vFrameReas );
    return pCexMin;
}